

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> _Var1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  pointer ppcVar3;
  char *__s;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> this_00;
  char cVar4;
  char cVar5;
  bool bVar6;
  uint __val;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  string *psVar10;
  SaveRestoreEnvironment *pSVar11;
  cmsysProcess *pcVar12;
  size_t sVar13;
  pointer __dest;
  uint uVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined8 unaff_R13;
  pointer __p;
  pointer ppcVar17;
  cmDuration cVar18;
  cmDuration cVar19;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar20;
  cmProcessOutput processOutput;
  string outerr;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  int length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *data;
  string strdata;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_428 [15];
  cmProcessOutput local_419;
  cmCTest *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  cmsysProcess *local_3f0;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> local_3e8;
  cmDuration local_3e0;
  vector<char,_std::allocator<char>_> local_3d8;
  int local_3b4;
  ostream *local_3b0;
  undefined1 local_3a8 [40];
  int *local_380;
  vector<char,_std::allocator<char>_> local_378;
  char *local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_358;
  undefined8 uStack_350;
  string *local_348;
  undefined1 local_340 [16];
  SaveRestoreEnvironment local_330 [4];
  ios_base local_2d0 [264];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = (undefined4)
             CONCAT71((int7)((ulong)unaff_R13 >> 8),
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start !=
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_418 = this;
  local_3f0 = (cmsysProcess *)testTimeOut.__r;
  local_3b0 = log;
  cVar18 = cmCTestScriptHandler::GetRemainingTimeAllowed
                     (&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                       ScriptHandler);
  local_3e0.__r =
       (rep_conflict)
       (~-(ulong)(cVar18.__r != 10000000.0) & (ulong)cVar18.__r |
       (ulong)(cVar18.__r + -120.0) & -(ulong)(cVar18.__r != 10000000.0));
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  cVar18.__r = ((_Var2._M_head_impl)->TimeOut).__r;
  uVar20 = extraout_XMM0_Qb;
  if ((0.0 < cVar18.__r) && (cVar18.__r < local_3e0.__r)) {
    uVar20 = 0;
    local_3e0.__r = cVar18.__r;
  }
  cVar18.__r = local_3e0.__r;
  if ((0.0 < (double)local_3f0) &&
     (local_358 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e0.__r, uStack_350 = uVar20,
     cVar19 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler),
     cVar18.__r = (rep_conflict)local_358, (double)local_3f0 < cVar19.__r)) {
    local_3e0.__r = (rep_conflict)local_3f0;
    cVar18.__r = (rep_conflict)local_3f0;
  }
  if (cVar18.__r <= 0.0) {
    local_3e0.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"Test timeout computed to be: ",0x1d);
  if ((local_3e0.__r != 10000000.0) || (NAN(local_3e0.__r))) {
    __val = cmDurationTo<unsigned_int>(&local_3e0);
    cVar5 = '\x01';
    if (9 < __val) {
      uVar14 = __val;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar14 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00150437;
        }
        if (uVar14 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00150437;
        }
        if (uVar14 < 10000) goto LAB_00150437;
        bVar6 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar6);
      cVar5 = cVar5 + '\x01';
    }
LAB_00150437:
    local_340._0_8_ = local_340 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_340,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_340._0_8_,local_340._8_4_,__val);
  }
  else {
    local_340._0_8_ = (long)local_340 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"infinite","");
  }
  local_3f0 = (cmsysProcess *)CONCAT44(local_3f0._4_4_,uVar16);
  local_358 = environment;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  _Var1._M_head_impl = (SaveRestoreEnvironment *)(local_340 + 0x10);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::__cxx11::stringbuf::str();
  Log(local_418,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4b3,(char *)local_340._0_8_,false);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator<char> *)local_340);
  psVar10 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar6 = cmsys::SystemTools::SameFile((string *)local_1c8,psVar10);
  local_380 = retVal;
  if (bVar6) {
    bVar6 = ((local_418->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess;
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
    if (bVar6 == false) {
      cmCTest((cmCTest *)&local_3d8);
      std::__cxx11::string::_M_assign
                ((string *)
                 (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 8));
      *(rep_conflict *)
       (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x22c8) = local_3e0.__r;
      local_348 = output;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      *(ostringstream **)
       (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x2340) = (ostringstream *)local_1c8;
      *(ostringstream **)
       (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x2348) = (ostringstream *)local_1c8;
      local_3a8._0_8_ = (pointer)0x0;
      local_3a8._8_8_ = (pointer)0x0;
      local_3a8._16_8_ = (pointer)0x0;
      ppcVar17 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar3 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar17 != ppcVar3) {
        do {
          local_3e8._M_head_impl = (SaveRestoreEnvironment *)*ppcVar17;
          if (local_3e8._M_head_impl != (SaveRestoreEnvironment *)0x0) {
            iVar7 = strcmp((char *)local_3e8._M_head_impl,"--build-generator");
            if ((iVar7 == 0) &&
               (((local_3e0.__r != 10000000.0 || (NAN(local_3e0.__r))) && (0.0 < local_3e0.__r)))) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[15]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_3a8,(char (*) [15])"--test-timeout");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
              cmDurationTo<unsigned_int>(&local_3e0);
              std::ostream::_M_insert<unsigned_long>((ulong)local_340);
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_3a8,&local_410);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != &local_410.field_2) {
                operator_delete(local_410._M_dataplus._M_p,
                                local_410.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
              std::ios_base::~ios_base(local_2d0);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_3a8,(char **)&local_3e8);
          }
          ppcVar17 = ppcVar17 + 1;
        } while (ppcVar17 != ppcVar3);
      }
      poVar9 = local_3b0;
      if (local_3b0 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_3b0,"* Run internal CTest",0x14);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      psVar10 = local_348;
      local_3e8._M_head_impl = (SaveRestoreEnvironment *)0x0;
      if ((char)local_3f0 != '\0') {
        pSVar11 = (SaveRestoreEnvironment *)operator_new(0x18);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar11);
        _Var1._M_head_impl = local_3e8._M_head_impl;
        local_340._0_8_ =
             (__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )0x0;
        bVar6 = local_3e8._M_head_impl != (SaveRestoreEnvironment *)0x0;
        local_3e8._M_head_impl = pSVar11;
        if (bVar6) {
          cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(_Var1._M_head_impl);
          operator_delete(_Var1._M_head_impl,0x18);
        }
        std::
        unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                       *)local_340);
        cmSystemTools::AppendEnv(local_358);
      }
      iVar7 = Run((cmCTest *)&local_3d8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3a8,psVar10);
      *local_380 = iVar7;
      if (psVar10 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)psVar10,local_340._0_8_);
        if ((SaveRestoreEnvironment *)local_340._0_8_ !=
            (SaveRestoreEnvironment *)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_,
                          CONCAT71(local_330[0].Env.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_330[0].Env.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
        }
        if (poVar9 != (ostream *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_340,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_340 +
                        (char)(((SaveRestoreEnvironment *)(local_340._0_8_ + -0x18))->Env).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        std::ostream::put((char)local_340);
        poVar9 = (ostream *)std::ostream::flush();
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_418,5,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
            ,0x4e4,local_410._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
        std::ios_base::~ios_base(local_2d0);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      if (*(long **)(local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x2398) != (long *)0x0) {
        (**(code **)(**(long **)(local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + 0x2398) + 8))();
      }
      std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::~unique_ptr
                ((unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_> *)&local_3d8)
      ;
      return 4;
    }
  }
  else if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
  local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
  }
  local_3e8._M_head_impl = (SaveRestoreEnvironment *)0x0;
  if ((char)local_3f0 != '\0') {
    pSVar11 = (SaveRestoreEnvironment *)operator_new(0x18);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar11);
    this_00._M_head_impl = local_3e8._M_head_impl;
    local_1c8._0_8_ = (_func_int **)0x0;
    bVar6 = local_3e8._M_head_impl != (SaveRestoreEnvironment *)0x0;
    local_3e8._M_head_impl = pSVar11;
    if (bVar6) {
      cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl,0x18);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)local_1c8);
    cmSystemTools::AppendEnv(local_358);
  }
  pcVar12 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (pcVar12,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  local_3f0 = pcVar12;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Command is: ",0xc);
  __s = *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_428 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) + 0x260);
  }
  else {
    sVar13 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,__s,sVar13);
  }
  std::ios::widen((char)(ostream *)local_1c8 + (char)*(_func_int **)(local_1c8._0_8_ + -0x18));
  std::ostream::put((char)local_1c8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_418,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4f6,(char *)local_340._0_8_,false);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pcVar12 = local_3f0;
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(local_3f0,0,1);
  }
  cmsysProcess_SetTimeout(pcVar12,local_3e0.__r);
  cmsysProcess_Execute(pcVar12);
  cmProcessOutput::cmProcessOutput(&local_419,encoding,0x400);
  local_340._8_8_ = 0;
  local_330[0].Env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
  local_340._0_8_ = _Var1._M_head_impl;
  while (iVar7 = cmsysProcess_WaitForData(local_3f0,&local_360,&local_3b4,(double *)0x0), iVar7 != 0
        ) {
    cmProcessOutput::DecodeText(&local_419,local_360,(long)local_3b4,(string *)local_340,0);
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_3d8,
                 local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_360,local_360 + local_3b4);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    if (local_340._8_8_ != 0) {
      std::ostream::write((char *)local_1c8,local_340._0_8_);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_418,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x508,local_410._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    if (local_3b0 != (ostream *)0x0) {
      std::ostream::write((char *)local_3b0,local_340._0_8_);
    }
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  cmProcessOutput::DecodeText(&local_419,&local_50,(string *)local_340,0);
  poVar9 = local_3b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pcVar12 = local_3f0;
  if (local_340._8_8_ != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    if (local_340._8_8_ != 0) {
      std::ostream::write(local_1c8,local_340._0_8_);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_418,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x510,local_410._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    if (poVar9 != (ostream *)0x0) {
      std::ostream::write((char *)poVar9,local_340._0_8_);
    }
  }
  cmsysProcess_WaitForExit(pcVar12,(double *)0x0);
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar15 = (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar15 == 0) {
    __dest = (pointer)0x0;
    sVar13 = 0;
  }
  else {
    if ((long)uVar15 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar15);
    sVar13 = (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __dest + uVar15;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = __dest;
  if (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = __dest;
    memmove(__dest,local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar13);
  }
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __dest + sVar13;
  cmProcessOutput::DecodeText(&local_419,&local_378,&local_3d8,0);
  pcVar12 = local_3f0;
  if (local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((output != (string *)0x0) &&
     (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"-- Process completed",0x14);
  std::ios::widen((char)(ostream *)local_1c8 + (char)*(_func_int **)(local_1c8._0_8_ + -0x18));
  std::ostream::put((char)local_1c8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_418,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x51c,local_410._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  iVar7 = cmsysProcess_GetState(pcVar12);
  if (iVar7 == 1) {
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,"\n*** ERROR executing: ","");
    cmsysProcess_GetErrorString(pcVar12);
    std::__cxx11::string::append((char *)&local_410);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,(ulong)local_410._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_410._M_dataplus._M_p,local_410._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_418,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x53a,(char *)local_3a8._0_8_,false);
  }
  else {
    if (iVar7 != 2) {
      if (iVar7 == 4) {
        iVar8 = cmsysProcess_GetExitValue(pcVar12);
        *local_380 = iVar8;
        if ((iVar8 != 0) &&
           (((local_418->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
            OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(local_418,&local_3d8);
        }
      }
      goto LAB_0015132d;
    }
    if (((local_418->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
        OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(local_418,&local_3d8);
    }
    iVar8 = cmsysProcess_GetExitException(pcVar12);
    *local_380 = iVar8;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,"\n*** Exception executing: ","");
    cmsysProcess_GetExceptionString(pcVar12);
    std::__cxx11::string::append((char *)&local_410);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,(ulong)local_410._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_410._M_dataplus._M_p,local_410._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_418,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x531,(char *)local_3a8._0_8_,false);
  }
  if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
    operator_delete((void *)local_3a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_3a8._16_8_)->_M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
LAB_0015132d:
  cmsysProcess_Delete(pcVar12);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != (SaveRestoreEnvironment *)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_419);
  std::
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                 *)&local_3e8);
  if (local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      cmAppend(tempOutput, data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}